

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerMSL::to_tesc_invocation_id_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  SPIREntryPoint *pSVar1;
  uint *in_R8;
  string local_30;
  
  if ((this->msl_options).multi_patch_workgroup == true) {
    CompilerGLSL::to_expression_abi_cxx11_
              (&local_30,&this->super_CompilerGLSL,this->builtin_invocation_id_id,true);
    pSVar1 = Compiler::get_entry_point((Compiler *)this);
    join<std::__cxx11::string,char_const(&)[6],unsigned_int&>
              (__return_storage_ptr__,(spirv_cross *)&local_30,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)".x % ",
               (char (*) [6])&pSVar1->output_vertices,in_R8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  else {
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (__return_storage_ptr__,this,8,1);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::to_tesc_invocation_id()
{
	if (msl_options.multi_patch_workgroup)
	{
		// n.b. builtin_invocation_id_id here is the dispatch global invocation ID,
		// not the TC invocation ID.
		return join(to_expression(builtin_invocation_id_id), ".x % ", get_entry_point().output_vertices);
	}
	else
		return builtin_to_glsl(BuiltInInvocationId, StorageClassInput);
}